

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O1

bool __thiscall
Storage::Tape::Oric::Parser::sync_and_get_encoding_speed
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape)

{
  bool bVar1;
  int iVar2;
  SymbolType SVar3;
  byte unaff_BL;
  
  this->detection_mode_ = Sync;
  do {
    iVar2 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_vptr_Tape)();
    if ((char)iVar2 != '\0') {
      unaff_BL = 0;
      break;
    }
    SVar3 = Parser<Storage::Tape::Oric::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::Oric::SymbolType> *)this,tape);
    if (SVar3 == FoundSlow) {
      unaff_BL = 0;
LAB_0045743d:
      bVar1 = false;
    }
    else {
      if (SVar3 == FoundFast) {
        unaff_BL = 1;
        goto LAB_0045743d;
      }
      bVar1 = true;
    }
  } while (bVar1);
  return (bool)(unaff_BL & 1);
}

Assistant:

bool Parser::sync_and_get_encoding_speed(const std::shared_ptr<Storage::Tape::Tape> &tape) {
	detection_mode_ = Sync;
	while(!tape->is_at_end()) {
		const SymbolType symbol = get_next_symbol(tape);
		switch(symbol) {
			case SymbolType::FoundSlow: return false;
			case SymbolType::FoundFast: return true;
			default: break;
		}
	}
	return false;
}